

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

uint prvTidyGetUTF8(ctmbstr str,uint *ch)

{
  int iVar1;
  int local_20;
  int err;
  int bytes;
  uint n;
  uint *ch_local;
  ctmbstr str_local;
  
  local_20 = 0;
  _bytes = ch;
  ch_local = (uint *)str;
  iVar1 = prvTidyDecodeUTF8BytesToChar
                    ((uint *)&err,(int)*str,str + 1,(TidyInputSource *)0x0,&local_20);
  if (iVar1 != 0) {
    err = 0xfffd;
  }
  *_bytes = err;
  return local_20 - 1;
}

Assistant:

uint TY_(GetUTF8)( ctmbstr str, uint *ch )
{
    uint n;
    int bytes;

    int err;
    
    bytes = 0;
    
    /* first byte "str[0]" is passed in separately from the */
    /* rest of the UTF-8 byte sequence starting at "str[1]" */
    err = TY_(DecodeUTF8BytesToChar)( &n, str[0], str+1, NULL, &bytes );
    if (err)
    {
#if 1 && defined(_DEBUG)
        fprintf(stderr, "pprint UTF-8 decoding error for U+%x : ", n);
#endif
        n = 0xFFFD; /* replacement char */
    }

    *ch = n;
    return bytes - 1;
}